

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
HecrSequential_cyclicRedictionFullMatrix_Test::TestBody
          (HecrSequential_cyclicRedictionFullMatrix_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ulong uVar3;
  char *message;
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  vec rhs;
  vec cs;
  vec bs;
  vec as;
  TridiagonalMatrix m;
  double rhs_values [7];
  double as_values [7];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  AssertHelper local_240;
  internal local_238 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  vec local_228;
  void *local_210;
  long local_208;
  long local_200;
  vec local_1f8;
  vec local_1e0;
  vec local_1c8;
  vec local_1b0;
  TridiagonalMatrix local_198;
  double local_148 [8];
  double local_108 [4];
  char local_e8 [24];
  double local_d0;
  double local_c8 [8];
  double local_88 [8];
  double local_48 [8];
  
  local_48[4] = 5.5;
  local_48[5] = -6.0;
  local_48[2] = 3.0;
  local_48[3] = 7.0;
  local_48[0] = 3.0;
  local_48[1] = 4.0;
  local_48[6] = 4.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1b0,local_48,local_48 + 7,
             (allocator_type *)&local_198);
  local_88[0] = 0.0;
  local_88[1] = -1.0;
  local_88[2] = 2.0;
  local_88[3] = 1.1;
  local_88[4] = 3.2;
  local_88[5] = 2.0;
  local_88[6] = 1.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1c8,local_88,local_88 + 7,
             (allocator_type *)&local_198);
  local_c8[6] = 0.0;
  local_c8[0] = 2.0;
  local_c8[1] = 0.5;
  local_c8[2] = -0.7;
  local_c8[3] = 1.0;
  local_c8[4] = 0.8;
  local_c8[5] = 1.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1e0,local_c8,local_c8 + 7,
             (allocator_type *)&local_198);
  TridiagonalMatrix::TridiagonalMatrix(&local_198,&local_1b0,&local_1c8,&local_1e0);
  builtin_strncpy(local_e8,"333333!@",9);
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8[0xb] = '\0';
  local_e8[0xc] = '\0';
  local_e8[0xd] = '\0';
  local_e8[0xe] = ':';
  local_e8[0xf] = '@';
  local_108[2] = 1.0;
  local_108[3] = 0.9;
  local_108[0] = 7.0;
  local_108[1] = 6.5;
  local_e8[0x10] = '\0';
  local_e8[0x11] = '\0';
  local_e8[0x12] = '\0';
  local_e8[0x13] = '\0';
  local_e8[0x14] = '\0';
  local_e8[0x15] = '\0';
  local_e8[0x16] = '*';
  local_e8[0x17] = '@';
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1f8,local_108,&local_d0,
             (allocator_type *)local_148);
  local_148[3] = 0.0;
  local_148[0] = 1.0;
  local_148[1] = 2.0;
  local_148[2] = -1.0;
  local_148[4] = 2.0;
  local_148[5] = -3.0;
  local_148[6] = 4.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_210,local_148,local_148 + 7,
             (allocator_type *)&local_228);
  cyclic_reduction(&local_228,&local_198,&local_1f8);
  if (local_208 - (long)local_210 == 0) {
    local_248.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_248.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar3 = 0;
    do {
      pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ABS(*(double *)((long)local_210 + uVar3 * 8) -
                   local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3]);
      if ((double)pbVar1 <= (double)local_248.ptr_) {
        pbVar1 = local_248.ptr_;
      }
      local_248.ptr_ = pbVar1;
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < (ulong)(local_208 - (long)local_210 >> 3));
  }
  testing::internal::CmpHelperLT<double,double>
            (local_238,"max_diff(xs, solution)","EPS",(double *)&local_248,&EPS);
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_230.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x79,message);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    if (((local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_248.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210 != (void *)0x0) {
    operator_delete(local_210,local_200 - (long)local_210);
  }
  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HecrSequential, cyclicRedictionFullMatrix)
{
    int size = 7;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 13 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}